

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

void __thiscall duckdb::RenderTree::SanitizeKeyNames(RenderTree *this)

{
  bool bVar1;
  type puVar2;
  pointer pRVar3;
  ulong __i;
  pointer ppVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  new_map;
  allocator local_1c2;
  allocator local_1c1;
  RenderTree *local_1c0;
  ulong local_1b8;
  pointer local_1b0;
  string local_1a8;
  string local_188;
  string local_168;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_1c0 = this;
  for (__i = 0; __i < local_1c0->height * local_1c0->width; __i = __i + 1) {
    puVar2 = unique_ptr<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[],_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_>,_true>
             ::operator[](&local_1c0->nodes,__i);
    if ((puVar2->
        super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>)._M_t
        .super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>
        .super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl !=
        (RenderTreeNode *)0x0) {
      local_148.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.map_idx._M_h._M_buckets = &local_148.map_idx._M_h._M_single_bucket;
      local_148.map_idx._M_h._M_bucket_count = 1;
      local_148.map_idx._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_148.map_idx._M_h._M_element_count = 0;
      local_148.map_idx._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_148.map_idx._M_h._M_rehash_policy._M_next_resize = 0;
      local_148.map_idx._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1b8 = __i;
      puVar2 = unique_ptr<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[],_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_>,_true>
               ::operator[](&local_1c0->nodes,__i);
      pRVar3 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
               ::operator->(puVar2);
      ppVar4 = (pRVar3->extra_text).map.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (pRVar3->extra_text).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVar4 == local_1b0) break;
        ::std::__cxx11::string::string((string *)&local_1a8,(string *)ppVar4);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&local_1a8);
        ::std::__cxx11::string::string((string *)&local_d0,"__",(allocator *)&local_70);
        bVar1 = StringUtil::StartsWith(&local_b0,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        if (bVar1) {
          ::std::__cxx11::string::string((string *)&local_f0,(string *)&local_1a8);
          ::std::__cxx11::string::string((string *)&local_168,"__",&local_1c1);
          ::std::__cxx11::string::string((string *)&local_188,anon_var_dwarf_4b71df5 + 9,&local_1c2)
          ;
          StringUtil::Replace(&local_70.first,&local_f0,&local_168,&local_188);
          ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_188);
          ::std::__cxx11::string::~string((string *)&local_168);
          ::std::__cxx11::string::~string((string *)&local_f0);
          ::std::__cxx11::string::string((string *)&local_90,(string *)&local_1a8);
          ::std::__cxx11::string::string((string *)&local_168,"_",&local_1c1);
          ::std::__cxx11::string::string((string *)&local_188," ",&local_1c2);
          StringUtil::Replace(&local_70.first,&local_90,&local_168,&local_188);
          ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_188);
          ::std::__cxx11::string::~string((string *)&local_168);
          ::std::__cxx11::string::~string((string *)&local_90);
          StringUtil::Title(&local_70.first,&local_1a8);
          ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_70,&local_1a8,&ppVar4->second);
        InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::insert(&local_148,&local_70);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_70);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        ppVar4 = ppVar4 + 1;
      }
      puVar2 = unique_ptr<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[],_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_>,_true>
               ::operator[](&local_1c0->nodes,local_1b8);
      pRVar3 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
               ::operator->(puVar2);
      InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&pRVar3->extra_text,&local_148);
      InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~InsertionOrderPreservingMap(&local_148);
      __i = local_1b8;
    }
  }
  return;
}

Assistant:

void RenderTree::SanitizeKeyNames() {
	for (idx_t i = 0; i < width * height; i++) {
		if (!nodes[i]) {
			continue;
		}
		InsertionOrderPreservingMap<string> new_map;
		for (auto &entry : nodes[i]->extra_text) {
			auto key = entry.first;
			if (StringUtil::StartsWith(key, "__")) {
				key = StringUtil::Replace(key, "__", "");
				key = StringUtil::Replace(key, "_", " ");
				key = StringUtil::Title(key);
			}
			auto &value = entry.second;
			new_map.insert(make_pair(key, value));
		}
		nodes[i]->extra_text = std::move(new_map);
	}
}